

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

int32_t __thiscall icu_63::UnifiedCache::_computeCountOfItemsToEvict(UnifiedCache *this)

{
  int *piVar1;
  int local_2c [3];
  int local_20;
  int32_t countOfItemsToEvict;
  int32_t unusedLimit;
  int32_t unusedLimitByPercentage;
  int32_t evictableItems;
  int32_t totalItems;
  UnifiedCache *this_local;
  
  _evictableItems = this;
  unusedLimitByPercentage = uhash_count_63(this->fHashtable);
  unusedLimit = unusedLimitByPercentage - this->fNumValuesInUse;
  countOfItemsToEvict = (this->fNumValuesInUse * this->fMaxPercentageOfInUse) / 100;
  piVar1 = std::max<int>(&countOfItemsToEvict,&this->fMaxUnused);
  local_20 = *piVar1;
  local_2c[1] = 0;
  local_2c[0] = unusedLimit - local_20;
  piVar1 = std::max<int>(local_2c + 1,local_2c);
  return *piVar1;
}

Assistant:

int32_t UnifiedCache::_computeCountOfItemsToEvict() const {
    int32_t totalItems = uhash_count(fHashtable);
    int32_t evictableItems = totalItems - fNumValuesInUse;

    int32_t unusedLimitByPercentage = fNumValuesInUse * fMaxPercentageOfInUse / 100;
    int32_t unusedLimit = std::max(unusedLimitByPercentage, fMaxUnused);
    int32_t countOfItemsToEvict = std::max(0, evictableItems - unusedLimit);
    return countOfItemsToEvict;
}